

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,ScopedMessage *old)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_type sVar5;
  uint uVar6;
  
  uVar2 = *(undefined4 *)((long)&(old->m_info).macroName.m_start + 4);
  sVar5 = (old->m_info).macroName.m_size;
  uVar3 = *(undefined4 *)((long)&(old->m_info).macroName.m_size + 4);
  *(undefined4 *)&(this->m_info).macroName.m_start = *(undefined4 *)&(old->m_info).macroName.m_start
  ;
  *(undefined4 *)((long)&(this->m_info).macroName.m_start + 4) = uVar2;
  *(int *)&(this->m_info).macroName.m_size = (int)sVar5;
  *(undefined4 *)((long)&(this->m_info).macroName.m_size + 4) = uVar3;
  (this->m_info).message._M_dataplus._M_p = (pointer)&(this->m_info).message.field_2;
  pcVar1 = (old->m_info).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).message,pcVar1,
             pcVar1 + (old->m_info).message._M_string_length);
  uVar6 = (old->m_info).sequence;
  (this->m_info).type = (old->m_info).type;
  (this->m_info).sequence = uVar6;
  sVar4 = (old->m_info).lineInfo.line;
  (this->m_info).lineInfo.file = (old->m_info).lineInfo.file;
  (this->m_info).lineInfo.line = sVar4;
  this->m_moved = false;
  old->m_moved = true;
  return;
}

Assistant:

ScopedMessage::ScopedMessage( ScopedMessage&& old )
    : m_info( old.m_info ), m_moved()
    {
        old.m_moved = true;
    }